

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O1

bool __thiscall HtmlModelSerialiser::loadModel(HtmlModelSerialiser *this,QString *source)

{
  HtmlModelSerialiserPrivate *this_00;
  bool bVar1;
  QXmlStreamReader reader;
  QXmlStreamReader aQStack_18 [8];
  
  if ((source == (QString *)0x0) ||
     (this_00 = (HtmlModelSerialiserPrivate *)
                (this->super_AbstractStringSerialiser).super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.m_model
     == (QAbstractItemModel *)0x0)) {
    bVar1 = false;
  }
  else {
    QXmlStreamReader::QXmlStreamReader(aQStack_18,source);
    bVar1 = HtmlModelSerialiserPrivate::readHtml(this_00,aQStack_18);
    QXmlStreamReader::~QXmlStreamReader(aQStack_18);
  }
  return bVar1;
}

Assistant:

bool HtmlModelSerialiser::loadModel(QString *source)
{
    if (!source)
        return false;
    Q_D(HtmlModelSerialiser);

    if (!d->m_model)
        return false;
    QXmlStreamReader reader(*source);
    return d->readHtml(reader);
}